

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Thermo::getCurrentDensity
          (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
           *__return_storage_ptr__,Thermo *this)

{
  _Rb_tree_header *p_Var1;
  Snapshot *pSVar2;
  bool bVar3;
  uint uVar4;
  Molecule *pMVar5;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> _Var6;
  difference_type dVar7;
  int __denom;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  MoleculeIterator *i;
  RigidBody *this_00;
  pointer ppAVar9;
  pointer ppRVar10;
  Atom *this_01;
  FixedChargeAdapter fca;
  AtomType *atype;
  MoleculeIterator miter;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> typeJc;
  FluctuatingChargeAdapter fqa;
  AtomTypeSet simTypes;
  Vector3d Jc;
  Vector3d v;
  double local_100;
  FixedChargeAdapter local_e8;
  AtomType *local_e0;
  MoleculeIterator local_d8;
  _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_d0;
  Snapshot *local_b8;
  FluctuatingChargeAdapter local_b0;
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  local_a8;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  pSVar2 = this->info_->sman_->currentSnapshot_;
  SimInfo::getSimulatedAtomTypes((AtomTypeSet *)&local_a8,this->info_);
  local_d8._M_node = (_Base_ptr)0x0;
  local_60.data_[0] = 0.0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_d0,local_60.data_);
  Vector<double,_3U>::Vector(&local_78,(Vector<double,_3U> *)&local_d0);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)&local_d0
             ,local_a8._M_impl.super__Rb_tree_header._M_node_count,(value_type *)OpenMD::V3Zero,
             (allocator_type *)&local_60);
  i = &local_d8;
  local_b8 = pSVar2;
  pMVar5 = SimInfo::beginMolecule(this->info_,i);
  p_Var1 = &local_a8._M_impl.super__Rb_tree_header;
  while (pMVar5 != (Molecule *)0x0) {
    ppRVar10 = (pMVar5->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppRVar10 !=
        (pMVar5->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0018c8d6;
    this_00 = (RigidBody *)0x0;
    while (this_00 != (RigidBody *)0x0) {
      RigidBody::updateAtomVel(this_00);
      ppRVar10 = ppRVar10 + 1;
      this_00 = (RigidBody *)0x0;
      if (ppRVar10 !=
          (pMVar5->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0018c8d6:
        this_00 = *ppRVar10;
      }
    }
    ppAVar9 = (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar9 !=
        (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_0018c9f8;
    this_01 = (Atom *)0x0;
    while (this_01 != (Atom *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_60,&this_01->super_StuntDouble);
      local_e8.at_ = this_01->atomType_;
      local_e0 = local_e8.at_;
      bVar3 = FixedChargeAdapter::isFixedCharge(&local_e8);
      local_100 = 0.0;
      if (bVar3) {
        local_100 = FixedChargeAdapter::getCharge(&local_e8);
      }
      local_b0.at_ = local_e0;
      bVar3 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_b0);
      if (bVar3) {
        local_100 = local_100 +
                    *(double *)
                     (*(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->
                                        currentSnapshot_->atomData).flucQPos.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                               (this_01->super_StuntDouble).storage_) +
                     (long)(this_01->super_StuntDouble).localIndex_ * 8);
      }
      _Var6 = std::
              __find_if<std::_Rb_tree_const_iterator<OpenMD::AtomType*>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::AtomType*const>>
                        (local_a8._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,&local_e0);
      if ((_Rb_tree_header *)_Var6._M_node != p_Var1) {
        dVar7 = std::__distance<std::_Rb_tree_const_iterator<OpenMD::AtomType*>>
                          (local_a8._M_impl.super__Rb_tree_header._M_header._M_left,_Var6._M_node);
        if ((int)dVar7 != -1) {
          operator*(&local_48,local_100,&local_60);
          Vector<double,_3U>::add
                    (&local_d0._M_impl.super__Vector_impl_data._M_start[(int)dVar7].
                      super_Vector<double,_3U>,&local_48);
        }
      }
      operator*(&local_48,local_100,&local_60);
      Vector<double,_3U>::add(&local_78,&local_48);
      ppAVar9 = ppAVar9 + 1;
      this_01 = (Atom *)0x0;
      if (ppAVar9 !=
          (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_0018c9f8:
        this_01 = *ppAVar9;
      }
    }
    i = &local_d8;
    pMVar5 = SimInfo::nextMolecule(this->info_,i);
  }
  Snapshot::getVolume(local_b8);
  Vector<double,_3U>::div(&local_78,(int)i,__denom);
  uVar8 = extraout_RDX;
  for (uVar4 = 0; uVar4 < local_a8._M_impl.super__Rb_tree_header._M_node_count; uVar4 = uVar4 + 1) {
    Vector<double,_3U>::div
              (&local_d0._M_impl.super__Vector_impl_data._M_start[uVar4].super_Vector<double,_3U>,
               (int)i,(int)uVar8);
    uVar8 = extraout_RDX_00;
  }
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (__return_storage_ptr__,(value_type *)&local_78);
  for (uVar4 = 0; uVar4 < local_a8._M_impl.super__Rb_tree_header._M_node_count; uVar4 = uVar4 + 1) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
              (__return_storage_ptr__,local_d0._M_impl.super__Vector_impl_data._M_start + uVar4);
  }
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&local_d0);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector3d> Thermo::getCurrentDensity() {
    Snapshot* snap       = info_->getSnapshotManager()->getCurrentSnapshot();
    AtomTypeSet simTypes = info_->getSimulatedAtomTypes();

    SimInfo::MoleculeIterator miter;
    std::vector<Atom*>::iterator iiter;
    std::vector<RigidBody*>::iterator ri;
    Molecule* mol;
    RigidBody* rb;
    Atom* atom;
    AtomType* atype;
    AtomTypeSet::iterator at;
    Vector3d Jc(0.0);
    std::vector<Vector3d> typeJc(simTypes.size(), V3Zero);

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      // change the velocities of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(ri); rb != NULL;
           rb = mol->nextRigidBody(ri)) {
        rb->updateAtomVel();
      }

      for (atom = mol->beginAtom(iiter); atom != NULL;
           atom = mol->nextAtom(iiter)) {
        Vector3d v = atom->getVel();
        RealType q = 0.0;
        int typeIndex(-1);

        atype                  = atom->getAtomType();
        FixedChargeAdapter fca = FixedChargeAdapter(atype);
        if (fca.isFixedCharge()) q = fca.getCharge();
        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
        if (fqa.isFluctuatingCharge()) q += atom->getFlucQPos();

        typeIndex = -1;
        at        = std::find(simTypes.begin(), simTypes.end(), atype);
        if (at != simTypes.end()) {
          typeIndex = std::distance(simTypes.begin(), at);
        }

        if (typeIndex != -1) { typeJc[typeIndex] += q * v; }
        Jc += q * v;
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &Jc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    for (unsigned int j = 0; j < simTypes.size(); j++) {
      MPI_Allreduce(MPI_IN_PLACE, &typeJc[j][0], 3, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
    }
#endif

    RealType vol = snap->getVolume();

    Jc /= (vol * Constants::currentDensityConvert);
    for (unsigned int j = 0; j < simTypes.size(); j++) {
      typeJc[j] /= (vol * Constants::currentDensityConvert);
    }

    std::vector<Vector3d> result;
    result.clear();

    result.push_back(Jc);
    for (unsigned int j = 0; j < simTypes.size(); j++)
      result.push_back(typeJc[j]);

    return result;
  }